

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecmath_test.cpp
# Opt level: O1

void __thiscall Vector_AngleBetween_Test::TestBody(Vector_AngleBetween_Test *this)

{
  AssertHelperData *pAVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  byte bVar11;
  bool bVar12;
  ulong uVar13;
  ulong uVar14;
  long lVar15;
  long lVar16;
  char *pcVar17;
  undefined1 *puVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  ulong uVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  longdouble in_ST0;
  longdouble in_ST2;
  float fVar26;
  double dVar27;
  float fVar55;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  float fVar54;
  float fVar56;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  double dVar28;
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [64];
  undefined1 auVar53 [64];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined8 uVar77;
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined8 uVar80;
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  double dVar83;
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  double dVar87;
  double dVar88;
  undefined1 auVar89 [16];
  undefined8 in_XMM8_Qb;
  AssertionResult gtest_ar_7;
  Float precise;
  AssertionResult gtest_ar;
  Float naive;
  Float abet;
  AssertHelper local_178;
  Vector3<float> local_170;
  undefined1 local_160 [12];
  undefined4 uStack_154;
  float local_14c;
  string local_148;
  undefined1 local_128 [16];
  undefined1 local_118 [16];
  undefined1 local_108 [16];
  long local_f0;
  long local_e8;
  AssertHelper local_e0;
  long local_d8;
  double local_d0;
  double local_c8;
  double local_c0;
  double local_b8;
  double local_b0;
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  undefined1 local_88 [8];
  float fStack_80;
  float fStack_7c;
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  double local_40;
  float local_34;
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  
  local_160._0_8_ = local_160._0_8_ & 0xffffffff00000000;
  local_170.super_Tuple3<pbrt::Vector3,_float>._0_8_ =
       local_170.super_Tuple3<pbrt::Vector3,_float>._0_8_ & 0xffffffff00000000;
  testing::internal::CmpHelperEQ<int,float>
            ((internal *)&local_148,"0","AngleBetween(Vector3f(1, 0, 0), Vector3f(1, 0, 0))",
             (int *)local_160,(float *)&local_170);
  if ((char)local_148._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)local_160);
    if ((undefined8 *)local_148._M_string_length == (undefined8 *)0x0) {
      pcVar17 = "";
    }
    else {
      pcVar17 = *(char **)local_148._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_170,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/vecmath_test.cpp"
               ,0x4b,pcVar17);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_170,(Message *)local_160);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_170);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_160._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar12 = testing::internal::IsTrue(true);
      if ((bVar12) &&
         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_160._0_8_
          != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_160._0_8_ + 8))();
      }
      local_160._0_8_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_148._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_170.super_Tuple3<pbrt::Vector3,_float>._0_8_ =
       local_170.super_Tuple3<pbrt::Vector3,_float>._0_8_ & 0xffffffff00000000;
  local_160._0_8_ = &DAT_3e7ad7f29abcaf48;
  testing::internal::CmpHelperLT<float,double>
            ((internal *)&local_148,
             "std::abs(AngleBetween(Vector3f(0, 0, 1), Vector3f(0, 0, -1))) - Pi","1e-7",
             (float *)&local_170,(double *)local_160);
  if ((char)local_148._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)local_160);
    if ((undefined8 *)local_148._M_string_length == (undefined8 *)0x0) {
      pcVar17 = "";
    }
    else {
      pcVar17 = *(char **)local_148._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_170,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/vecmath_test.cpp"
               ,0x4d,pcVar17);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_170,(Message *)local_160);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_170);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_160._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar12 = testing::internal::IsTrue(true);
      if ((bVar12) &&
         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_160._0_8_
          != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_160._0_8_ + 8))();
      }
      local_160._0_8_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_148._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_170.super_Tuple3<pbrt::Vector3,_float>.x = -1.1920929e-07;
  local_160._0_8_ = &DAT_3e7ad7f29abcaf48;
  testing::internal::CmpHelperLT<float,double>
            ((internal *)&local_148,
             "std::abs(AngleBetween(Vector3f(1, 0, 0), Vector3f(0, 1, 0))) - Pi / 2","1e-7",
             (float *)&local_170,(double *)local_160);
  if ((char)local_148._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)local_160);
    if ((undefined8 *)local_148._M_string_length == (undefined8 *)0x0) {
      pcVar17 = "";
    }
    else {
      pcVar17 = *(char **)local_148._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_170,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/vecmath_test.cpp"
               ,0x4f,pcVar17);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_170,(Message *)local_160);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_170);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_160._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar12 = testing::internal::IsTrue(true);
      if ((bVar12) &&
         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_160._0_8_
          != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_160._0_8_ + 8))();
      }
      local_160._0_8_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_148._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_160._0_8_ = local_160._0_8_ & 0xffffffff00000000;
  local_170.super_Tuple3<pbrt::Vector3,_float>._0_8_ =
       local_170.super_Tuple3<pbrt::Vector3,_float>._0_8_ & 0xffffffff00000000;
  testing::internal::CmpHelperEQ<int,float>
            ((internal *)&local_148,"0","AngleBetween(x, x)",(int *)local_160,(float *)&local_170);
  if ((char)local_148._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)local_160);
    if ((undefined8 *)local_148._M_string_length == (undefined8 *)0x0) {
      pcVar17 = "";
    }
    else {
      pcVar17 = *(char **)local_148._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_170,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/vecmath_test.cpp"
               ,0x52,pcVar17);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_170,(Message *)local_160);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_170);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_160._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar12 = testing::internal::IsTrue(true);
      if ((bVar12) &&
         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_160._0_8_
          != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_160._0_8_ + 8))();
      }
      local_160._0_8_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_148._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_170.super_Tuple3<pbrt::Vector3,_float>._0_8_ =
       local_170.super_Tuple3<pbrt::Vector3,_float>._0_8_ & 0xffffffff00000000;
  local_160._0_8_ = &DAT_3e9421f5f40d8376;
  testing::internal::CmpHelperLT<float,double>
            ((internal *)&local_148,"std::abs(AngleBetween(x, -x) - Pi)","3e-7",(float *)&local_170,
             (double *)local_160);
  if ((char)local_148._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)local_160);
    if ((undefined8 *)local_148._M_string_length == (undefined8 *)0x0) {
      pcVar17 = "";
    }
    else {
      pcVar17 = *(char **)local_148._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_170,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/vecmath_test.cpp"
               ,0x53,pcVar17);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_170,(Message *)local_160);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_170);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_160._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar12 = testing::internal::IsTrue(true);
      if ((bVar12) &&
         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_160._0_8_
          != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_160._0_8_ + 8))();
      }
      local_160._0_8_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_148._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  puVar18 = &DAT_5851f42d4c957f2e;
  lVar20 = -0x3f4e7330b1dad2e9;
  lVar15 = -0x344a09b9bfb5a9f4;
  local_e8 = -0x38fcced62d42ebe3;
  local_f0 = 0x30705b042917ec1a;
  lVar16 = 0x20fd5db43a776693;
  local_d8 = 1;
  dVar27 = 0.0;
  do {
    uVar13 = ((ulong)dVar27 >> 0x1b ^ (ulong)dVar27) * -0x7e25210b43d22bb3;
    uVar13 = uVar13 >> 0x21 ^ uVar13;
    auVar23._8_8_ = 0;
    auVar23._0_8_ = uVar13 * 0x685f98a2018fade9 + lVar20;
    auVar25._8_8_ = 0;
    auVar25._0_8_ = puVar18 + uVar13 * 0x5851f42d4c957f2d;
    auVar29 = vpunpcklqdq_avx(auVar25,auVar23);
    auVar25 = vpmovsxbq_avx(ZEXT216(0x2d1b));
    auVar23 = vpsrlvq_avx2(auVar29,auVar25);
    auVar58 = vpmovsxbq_avx(ZEXT216(0x1b2d));
    auVar24 = vpsrlvq_avx2(auVar29,auVar58);
    auVar23 = vpshufd_avx(auVar23 ^ auVar24,0xe8);
    auVar29 = vpsrlq_avx(auVar29,0x3b);
    auVar29 = vpshufd_avx(auVar29,0xe8);
    auVar23 = vprorvd_avx512vl(auVar23,auVar29);
    auVar23 = vcvtudq2ps_avx512vl(auVar23);
    auVar24._0_4_ = auVar23._0_4_ * 2.3283064e-10;
    auVar24._4_4_ = auVar23._4_4_ * 2.3283064e-10;
    auVar24._8_4_ = auVar23._8_4_ * 2.3283064e-10;
    auVar24._12_4_ = auVar23._12_4_ * 2.3283064e-10;
    auVar84._8_4_ = 0x3f7fffff;
    auVar84._0_8_ = 0x3f7fffff3f7fffff;
    auVar84._12_4_ = 0x3f7fffff;
    auVar23 = vminps_avx(auVar24,auVar84);
    auVar30._8_4_ = 0xbf800000;
    auVar30._0_8_ = 0xbf800000bf800000;
    auVar30._12_4_ = 0xbf800000;
    auVar29._8_4_ = 0x40000000;
    auVar29._0_8_ = 0x4000000040000000;
    auVar29._12_4_ = 0x40000000;
    auVar24 = vfmadd132ps_avx512vl(auVar23,auVar30,auVar29);
    auVar31._0_4_ = auVar24._0_4_ * auVar24._0_4_;
    auVar31._4_4_ = auVar24._4_4_ * auVar24._4_4_;
    auVar31._8_4_ = auVar24._8_4_ * auVar24._8_4_;
    auVar31._12_4_ = auVar24._12_4_ * auVar24._12_4_;
    auVar23 = vhaddps_avx(auVar31,auVar31);
    auVar57._8_8_ = 0;
    auVar57._0_8_ = uVar13 * 0xb046976f22528f5 + lVar15;
    auVar71._8_8_ = 0;
    auVar71._0_8_ = uVar13 * -0xf72fd4feea08587 + lVar16;
    auVar29 = vpunpcklqdq_avx(auVar71,auVar57);
    auVar58 = vpsrlvq_avx2(auVar29,auVar58);
    auVar25 = vpsrlvq_avx2(auVar29,auVar25);
    auVar25 = vpshufd_avx(auVar25 ^ auVar58,0xe8);
    auVar58 = vpsrlq_avx(auVar29,0x3b);
    auVar58 = vpshufd_avx(auVar58,0xe8);
    auVar25 = vprorvd_avx512vl(auVar25,auVar58);
    auVar25 = vcvtudq2ps_avx512vl(auVar25);
    auVar58._0_4_ = auVar25._0_4_ * 2.3283064e-10;
    auVar58._4_4_ = auVar25._4_4_ * 2.3283064e-10;
    auVar58._8_4_ = auVar25._8_4_ * 2.3283064e-10;
    auVar58._12_4_ = auVar25._12_4_ * 2.3283064e-10;
    auVar25 = vmovshdup_avx(auVar58);
    uVar22 = vcmpps_avx512vl(auVar58,auVar84,1);
    bVar11 = (byte)(uVar22 >> 1);
    auVar25 = vfmadd132ss_fma(ZEXT416((uint)(bVar11 & 1) * auVar25._0_4_ +
                                      (uint)!(bool)(bVar11 & 1) * 0x3f7fffff),
                              SUB6416(ZEXT464(0xbf800000),0),ZEXT416(0x40000000));
    fVar26 = auVar23._0_4_ + auVar25._0_4_ * auVar25._0_4_;
    local_b0 = dVar27;
    if (fVar26 < 0.0) {
      local_128 = auVar24;
      local_118 = auVar58;
      local_108 = auVar25;
      local_160._8_4_ = sqrtf(fVar26);
      auVar25 = local_108;
      auVar58 = local_118;
      auVar24 = local_128;
    }
    else {
      auVar23 = vsqrtss_avx(ZEXT416((uint)fVar26),ZEXT416((uint)fVar26));
      local_160._8_4_ = auVar23._0_4_;
    }
    auVar59._4_4_ = local_160._8_4_;
    auVar59._0_4_ = local_160._8_4_;
    auVar59._8_4_ = local_160._8_4_;
    auVar59._12_4_ = local_160._8_4_;
    auVar23 = vdivps_avx(auVar24,auVar59);
    local_160._8_4_ = auVar25._0_4_ / (float)local_160._8_4_;
    local_160._0_8_ = vmovlps_avx(auVar23);
    auVar32._8_8_ = 0;
    auVar32._0_8_ = uVar13 * 0x696d29da565ad7fd + local_f0;
    auVar60._8_8_ = 0;
    auVar60._0_8_ = uVar13 * -0x4b2c51c6d8d41ef + local_e8;
    auVar25 = vpunpcklqdq_avx(auVar60,auVar32);
    auVar23 = vpsrlvq_avx2(auVar25,_DAT_005655c0);
    auVar29 = vpsrlvq_avx2(auVar25,_DAT_005655d0);
    auVar23 = vpshufd_avx(auVar23 ^ auVar29,0xe8);
    auVar25 = vpsrlq_avx(auVar25,0x3b);
    auVar25 = vpshufd_avx(auVar25,0xe8);
    auVar23 = vprorvd_avx512vl(auVar23,auVar25);
    auVar23 = vcvtudq2ps_avx512vl(auVar23);
    auVar2._8_4_ = 0x2f800000;
    auVar2._0_8_ = 0x2f8000002f800000;
    auVar2._12_4_ = 0x2f800000;
    auVar23 = vmulps_avx512vl(auVar23,auVar2);
    auVar3._8_4_ = 0x3f7fffff;
    auVar3._0_8_ = 0x3f7fffff3f7fffff;
    auVar3._12_4_ = 0x3f7fffff;
    auVar23 = vminps_avx512vl(auVar23,auVar3);
    auVar33._8_4_ = 0xbf800000;
    auVar33._0_8_ = 0xbf800000bf800000;
    auVar33._12_4_ = 0xbf800000;
    auVar4._8_4_ = 0x40000000;
    auVar4._0_8_ = 0x4000000040000000;
    auVar4._12_4_ = 0x40000000;
    auVar29 = vfmadd132ps_avx512vl(auVar23,auVar33,auVar4);
    auVar34._0_4_ = auVar29._0_4_ * auVar29._0_4_;
    auVar34._4_4_ = auVar29._4_4_ * auVar29._4_4_;
    auVar34._8_4_ = auVar29._8_4_ * auVar29._8_4_;
    auVar34._12_4_ = auVar29._12_4_ * auVar29._12_4_;
    auVar23 = vhaddps_avx(auVar34,auVar34);
    auVar25 = vminss_avx(auVar58,SUB6416(ZEXT464(0x3f7fffff),0));
    auVar25 = vfmadd132ss_fma(auVar25,SUB6416(ZEXT464(0xbf800000),0),ZEXT416(0x40000000));
    fVar54 = auVar25._0_4_;
    fVar26 = auVar23._0_4_ + fVar54 * fVar54;
    local_118._0_4_ = local_160._8_4_;
    if (fVar26 < 0.0) {
      local_108._0_4_ = fVar54;
      local_128 = auVar29;
      fVar54 = sqrtf(fVar26);
      auVar25 = ZEXT416((uint)local_108._0_4_);
      auVar29 = local_128;
      fVar26 = (float)local_118._0_4_;
    }
    else {
      auVar23 = vsqrtss_avx(ZEXT416((uint)fVar26),ZEXT416((uint)fVar26));
      fVar54 = auVar23._0_4_;
      fVar26 = (float)local_160._8_4_;
    }
    auVar61._4_4_ = fVar54;
    auVar61._0_4_ = fVar54;
    auVar61._8_4_ = fVar54;
    auVar61._12_4_ = fVar54;
    local_108 = vdivps_avx(auVar29,auVar61);
    auVar72._0_4_ = auVar25._0_4_ / fVar54;
    auVar72._4_12_ = auVar25._4_12_;
    local_170.super_Tuple3<pbrt::Vector3,_float>._0_8_ = vmovlps_avx(local_108);
    local_98._0_8_ = (undefined8)fVar26;
    register0x00001308 = 0;
    local_88 = local_160._0_8_;
    local_a8 = vmovshdup_avx(_local_88);
    local_58._0_8_ = (undefined8)(float)local_160._0_8_;
    local_68._0_8_ = (undefined8)local_a8._0_4_;
    dVar27 = (double)local_98._0_8_ * (double)local_98._0_8_ +
             (double)local_58._0_8_ * (double)local_58._0_8_ +
             (double)local_68._0_8_ * (double)local_68._0_8_;
    local_128._0_4_ = auVar72._0_4_;
    local_170.super_Tuple3<pbrt::Vector3,_float>.z = auVar72._0_4_;
    if (dVar27 < 0.0) {
      dVar27 = sqrt(dVar27);
      auVar72 = ZEXT416((uint)local_128._0_4_);
    }
    else {
      auVar35._8_8_ = 0;
      auVar35._0_8_ = dVar27;
      auVar23 = vsqrtsd_avx(auVar35,auVar35);
      dVar27 = auVar23._0_8_;
    }
    lVar19 = local_d8;
    local_78 = vmovshdup_avx(local_108);
    dVar83 = (double)local_108._0_4_;
    uVar80 = local_108._8_8_;
    dVar88 = (double)local_78._0_4_;
    dVar87 = (double)auVar72._0_4_;
    uVar77 = auVar72._8_8_;
    dVar28 = dVar87 * dVar87 + dVar83 * dVar83 + dVar88 * dVar88;
    if (dVar28 < 0.0) {
      local_d0 = dVar88;
      local_c8 = dVar83;
      local_c0 = dVar87;
      local_b8 = dVar27;
      dVar28 = sqrt(dVar28);
      uVar80 = 0;
      uVar77 = 0;
      dVar83 = local_c8;
      dVar87 = local_c0;
      dVar27 = local_b8;
      dVar88 = local_d0;
    }
    else {
      auVar36._8_8_ = 0;
      auVar36._0_8_ = dVar28;
      auVar23 = vsqrtsd_avx(auVar36,auVar36);
      dVar28 = auVar23._0_8_;
    }
    auVar62._0_8_ = (double)local_58._0_8_ / dVar27;
    auVar62._8_8_ = 0;
    auVar78._0_8_ = (double)local_98._0_8_ / dVar27;
    auVar78._8_8_ = 0;
    auVar81._0_8_ = dVar83 / dVar28;
    auVar81._8_8_ = uVar80;
    auVar73._8_8_ = 0;
    auVar73._0_8_ = ((double)local_68._0_8_ / dVar27) * (dVar88 / dVar28);
    auVar23 = vfmadd231sd_fma(auVar73,auVar62,auVar81);
    auVar37._0_8_ = dVar87 / dVar28;
    auVar37._8_8_ = uVar77;
    auVar23 = vfmadd213sd_fma(auVar37,auVar78,auVar23);
    dVar27 = acos(auVar23._0_8_);
    local_98._0_8_ = dVar27;
    auVar23 = vfmadd231ss_fma(ZEXT416((uint)((float)local_78._0_4_ * (float)local_a8._0_4_)),
                              _local_88,local_108);
    auVar23 = vfmadd231ss_fma(auVar23,ZEXT416((uint)local_118._0_4_),ZEXT416((uint)local_128._0_4_))
    ;
    if (0.0 <= auVar23._0_4_) {
      auVar23 = vsubps_avx(local_108,_local_88);
      auVar39._0_4_ = auVar23._0_4_ * auVar23._0_4_;
      auVar39._4_4_ = auVar23._4_4_ * auVar23._4_4_;
      auVar39._8_4_ = auVar23._8_4_ * auVar23._8_4_;
      auVar39._12_4_ = auVar23._12_4_ * auVar23._12_4_;
      auVar23 = vhaddps_avx(auVar39,auVar39);
      fVar26 = ((float)local_128._0_4_ - (float)local_118._0_4_) *
               ((float)local_128._0_4_ - (float)local_118._0_4_) + auVar23._0_4_;
      if (fVar26 < 0.0) {
        fVar26 = sqrtf(fVar26);
      }
      else {
        auVar23 = vsqrtss_avx(ZEXT416((uint)fVar26),ZEXT416((uint)fVar26));
        fVar26 = auVar23._0_4_;
      }
      auVar23 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),ZEXT416((uint)(fVar26 * 0.5)));
      uVar77 = vcmpss_avx512f(ZEXT416((uint)(fVar26 * 0.5)),SUB6416(ZEXT464(0xbf800000),0),1);
      bVar12 = (bool)((byte)uVar77 & 1);
      fVar26 = asinf((float)((uint)bVar12 * -0x40800000 + (uint)!bVar12 * auVar23._0_4_));
      fVar26 = fVar26 + fVar26;
    }
    else {
      fVar26 = local_88._0_4_ + local_108._0_4_;
      fVar54 = local_88._4_4_ + local_108._4_4_;
      fVar55 = local_88._8_4_ + local_108._8_4_;
      fVar56 = local_88._12_4_ + local_108._12_4_;
      auVar38._0_4_ = fVar26 * fVar26;
      auVar38._4_4_ = fVar54 * fVar54;
      auVar38._8_4_ = fVar55 * fVar55;
      auVar38._12_4_ = fVar56 * fVar56;
      auVar23 = vhaddps_avx(auVar38,auVar38);
      fVar26 = ((float)local_118._0_4_ + (float)local_128._0_4_) *
               ((float)local_118._0_4_ + (float)local_128._0_4_) + auVar23._0_4_;
      if (fVar26 < 0.0) {
        fVar26 = sqrtf(fVar26);
      }
      else {
        auVar23 = vsqrtss_avx(ZEXT416((uint)fVar26),ZEXT416((uint)fVar26));
        fVar26 = auVar23._0_4_;
      }
      auVar23 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),ZEXT416((uint)(fVar26 * 0.5)));
      uVar77 = vcmpss_avx512f(ZEXT416((uint)(fVar26 * 0.5)),SUB6416(ZEXT464(0xbf800000),0),1);
      bVar12 = (bool)((byte)uVar77 & 1);
      auVar52._0_4_ = asinf((float)((uint)bVar12 * -0x40800000 + (uint)!bVar12 * auVar23._0_4_));
      auVar52._4_60_ = extraout_var;
      auVar23 = vfmadd132ss_fma(auVar52._0_16_,SUB6416(ZEXT464(0x40490fdb),0),ZEXT416(0xc0000000));
      fVar26 = auVar23._0_4_;
    }
    local_14c = (float)(double)local_98._0_8_;
    local_128._0_4_ = fVar26;
    auVar5._8_4_ = 0x7fffffff;
    auVar5._0_8_ = 0x7fffffff7fffffff;
    auVar5._12_4_ = 0x7fffffff;
    auVar23 = vandps_avx512vl(ZEXT416((uint)(local_14c - fVar26)),auVar5);
    local_118._0_4_ = local_14c;
    local_14c = auVar23._0_4_ / local_14c;
    local_178.data_ = (AssertHelperData *)&DAT_3ed4f8b588e368f1;
    testing::internal::CmpHelperLT<float,double>
              ((internal *)&local_148,"err","5e-6",&local_14c,(double *)&local_178);
    if ((char)local_148._M_dataplus._M_p == '\0') {
      testing::Message::Message((Message *)&local_178);
      std::ostream::_M_insert<double>((double)(float)local_118._0_4_);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&(local_178.data_)->line,"vs ",3);
      std::ostream::_M_insert<double>((double)(float)local_128._0_4_);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&(local_178.data_)->line,", a: ",5);
      pbrt::operator<<((ostream *)&(local_178.data_)->line,(Vector3<float> *)local_160);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&(local_178.data_)->line,", b: ",5);
      pbrt::operator<<((ostream *)&(local_178.data_)->line,&local_170);
      pcVar17 = "";
      if ((undefined8 *)local_148._M_string_length != (undefined8 *)0x0) {
        pcVar17 = *(char **)local_148._M_string_length;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_e0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/vecmath_test.cpp"
                 ,0x67,pcVar17);
      testing::internal::AssertHelper::operator=(&local_e0,(Message *)&local_178);
      testing::internal::AssertHelper::~AssertHelper(&local_e0);
      if (local_178.data_ != (AssertHelperData *)0x0) {
        bVar12 = testing::internal::IsTrue(true);
        if ((bVar12) && (local_178.data_ != (AssertHelperData *)0x0)) {
          (**(code **)(*(long *)local_178.data_ + 8))();
        }
        local_178.data_ = (AssertHelperData *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_148._M_string_length,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    lVar20 = lVar20 + -0x7e9ce66163b5a5d2;
    lVar15 = lVar15 + -0x689413737f6b53e8;
    local_e8 = local_e8 + -0x71f99dac5a85d7c6;
    local_f0 = local_f0 + 0x60e0b608522fd834;
    lVar16 = lVar16 + 0x41fabb6874eecd26;
    local_d8 = lVar19 + 2;
    puVar18 = puVar18 + -0x4f5c17a566d501a4;
    dVar27 = (double)((long)local_b0 + 0x7fb5d329728ea185);
  } while (local_d8 != 0x30d41);
  lVar19 = -0x4691e8297086c7e9;
  lVar21 = 0x31b2e823d5b6720c;
  local_e8 = -0x16846185fa2cd2e3;
  local_f0 = 0x60650bbda8927e1a;
  lVar20 = 0x4e2fb43c6ca23d93;
  lVar15 = 0x1312d01;
  lVar16 = -0x55c9d73fe6416ad2;
  uVar22 = 0xc53fe288c0ecb080;
  do {
    uVar14 = (uVar22 >> 0x1b ^ uVar22) * -0x7e25210b43d22bb3;
    uVar14 = uVar14 >> 0x21 ^ uVar14;
    auVar40._8_8_ = 0;
    auVar40._0_8_ = uVar14 * 0x685f98a2018fade9 + lVar19;
    auVar63._8_8_ = 0;
    auVar63._0_8_ = uVar14 * 0x5851f42d4c957f2d + lVar16;
    auVar29 = vpunpcklqdq_avx(auVar63,auVar40);
    auVar25 = vpmovsxbq_avx(ZEXT216(0x2d1b));
    auVar23 = vpsrlvq_avx2(auVar29,auVar25);
    auVar58 = vpmovsxbq_avx(ZEXT216(0x1b2d));
    auVar24 = vpsrlvq_avx2(auVar29,auVar58);
    auVar23 = vpshufd_avx(auVar23 ^ auVar24,0xe8);
    auVar29 = vpsrlq_avx(auVar29,0x3b);
    auVar29 = vpshufd_avx(auVar29,0xe8);
    auVar23 = vprorvd_avx512vl(auVar23,auVar29);
    auVar23 = vcvtudq2ps_avx512vl(auVar23);
    auVar41._0_4_ = auVar23._0_4_ * 2.3283064e-10;
    auVar41._4_4_ = auVar23._4_4_ * 2.3283064e-10;
    auVar41._8_4_ = auVar23._8_4_ * 2.3283064e-10;
    auVar41._12_4_ = auVar23._12_4_ * 2.3283064e-10;
    auVar85._8_4_ = 0x3f7fffff;
    auVar85._0_8_ = 0x3f7fffff3f7fffff;
    auVar85._12_4_ = 0x3f7fffff;
    auVar23 = vminps_avx(auVar41,auVar85);
    auVar42._8_4_ = 0xbf800000;
    auVar42._0_8_ = 0xbf800000bf800000;
    auVar42._12_4_ = 0xbf800000;
    auVar6._8_4_ = 0x40000000;
    auVar6._0_8_ = 0x4000000040000000;
    auVar6._12_4_ = 0x40000000;
    local_128 = vfmadd132ps_avx512vl(auVar23,auVar42,auVar6);
    auVar43._0_4_ = local_128._0_4_ * local_128._0_4_;
    auVar43._4_4_ = local_128._4_4_ * local_128._4_4_;
    auVar43._8_4_ = local_128._8_4_ * local_128._8_4_;
    auVar43._12_4_ = local_128._12_4_ * local_128._12_4_;
    auVar23 = vhaddps_avx(auVar43,auVar43);
    auVar64._8_8_ = 0;
    auVar64._0_8_ = uVar14 * 0xb046976f22528f5 + lVar21;
    auVar74._8_8_ = 0;
    auVar74._0_8_ = uVar14 * -0xf72fd4feea08587 + lVar20;
    auVar29 = vpunpcklqdq_avx(auVar74,auVar64);
    auVar58 = vpsrlvq_avx2(auVar29,auVar58);
    auVar25 = vpsrlvq_avx2(auVar29,auVar25);
    auVar25 = vpshufd_avx(auVar25 ^ auVar58,0xe8);
    auVar58 = vpsrlq_avx(auVar29,0x3b);
    auVar58 = vpshufd_avx(auVar58,0xe8);
    auVar25 = vprorvd_avx512vl(auVar25,auVar58);
    auVar25 = vcvtudq2ps_avx512vl(auVar25);
    local_118._0_4_ = auVar25._0_4_ * 2.3283064e-10;
    local_118._4_4_ = auVar25._4_4_ * 2.3283064e-10;
    local_118._8_4_ = auVar25._8_4_ * 2.3283064e-10;
    local_118._12_4_ = auVar25._12_4_ * 2.3283064e-10;
    auVar25 = vmovshdup_avx(local_118);
    uVar13 = vcmpps_avx512vl(local_118,auVar85,1);
    bVar11 = (byte)(uVar13 >> 1);
    auVar25 = vfmadd132ss_fma(ZEXT416((uint)(bVar11 & 1) * auVar25._0_4_ +
                                      (uint)!(bool)(bVar11 & 1) * 0x3f7fffff),
                              SUB6416(ZEXT464(0xbf800000),0),ZEXT416(0x40000000));
    fVar26 = auVar23._0_4_ + auVar25._0_4_ * auVar25._0_4_;
    local_d8 = lVar15;
    local_b8 = (double)lVar16;
    if (fVar26 < 0.0) {
      local_108 = auVar25;
      fVar26 = sqrtf(fVar26);
      auVar25 = local_108;
    }
    else {
      auVar23 = vsqrtss_avx(ZEXT416((uint)fVar26),ZEXT416((uint)fVar26));
      fVar26 = auVar23._0_4_;
    }
    auVar65._4_4_ = fVar26;
    auVar65._0_4_ = fVar26;
    auVar65._8_4_ = fVar26;
    auVar65._12_4_ = fVar26;
    auVar23 = vdivps_avx(local_128,auVar65);
    auVar89._0_4_ = auVar25._0_4_ / fVar26;
    auVar89._4_12_ = auVar25._4_12_;
    local_160._0_8_ = vmovlps_avx(auVar23);
    auVar44._8_8_ = 0;
    auVar44._0_8_ = uVar14 * 0x696d29da565ad7fd + local_f0;
    auVar66._8_8_ = 0;
    auVar66._0_8_ = uVar14 * -0x4b2c51c6d8d41ef + local_e8;
    auVar25 = vpunpcklqdq_avx(auVar66,auVar44);
    auVar23 = vpsrlvq_avx2(auVar25,_DAT_005655c0);
    auVar58 = vpsrlvq_avx2(auVar25,_DAT_005655d0);
    auVar23 = vpshufd_avx(auVar23 ^ auVar58,0xe8);
    auVar25 = vpsrlq_avx(auVar25,0x3b);
    auVar25 = vpshufd_avx(auVar25,0xe8);
    auVar23 = vprorvd_avx512vl(auVar23,auVar25);
    auVar23 = vcvtudq2ps_avx512vl(auVar23);
    auVar7._8_4_ = 0x2f800000;
    auVar7._0_8_ = 0x2f8000002f800000;
    auVar7._12_4_ = 0x2f800000;
    auVar23 = vmulps_avx512vl(auVar23,auVar7);
    auVar8._8_4_ = 0x3f7fffff;
    auVar8._0_8_ = 0x3f7fffff3f7fffff;
    auVar8._12_4_ = 0x3f7fffff;
    auVar23 = vminps_avx512vl(auVar23,auVar8);
    auVar45._8_4_ = 0xbf800000;
    auVar45._0_8_ = 0xbf800000bf800000;
    auVar45._12_4_ = 0xbf800000;
    auVar9._8_4_ = 0x40000000;
    auVar9._0_8_ = 0x4000000040000000;
    auVar9._12_4_ = 0x40000000;
    local_128 = vfmadd132ps_avx512vl(auVar23,auVar45,auVar9);
    auVar46._0_4_ = local_128._0_4_ * local_128._0_4_;
    auVar46._4_4_ = local_128._4_4_ * local_128._4_4_;
    auVar46._8_4_ = local_128._8_4_ * local_128._8_4_;
    auVar46._12_4_ = local_128._12_4_ * local_128._12_4_;
    auVar23 = vhaddps_avx(auVar46,auVar46);
    auVar25 = vminss_avx(local_118,SUB6416(ZEXT464(0x3f7fffff),0));
    auVar25 = vfmadd132ss_fma(auVar25,SUB6416(ZEXT464(0xbf800000),0),ZEXT416(0x40000000));
    fVar54 = auVar25._0_4_;
    fVar26 = auVar23._0_4_ + fVar54 * fVar54;
    if (fVar26 < 0.0) {
      local_108._0_4_ = fVar54;
      local_160._8_4_ = auVar89._0_4_;
      local_118 = auVar89;
      fVar26 = sqrtf(fVar26);
      auVar25 = ZEXT416((uint)local_108._0_4_);
    }
    else {
      auVar23 = vsqrtss_avx(ZEXT416((uint)fVar26),ZEXT416((uint)fVar26));
      fVar26 = auVar23._0_4_;
      local_118 = auVar89;
    }
    auVar67._4_4_ = fVar26;
    auVar67._0_4_ = fVar26;
    auVar67._8_4_ = fVar26;
    auVar67._12_4_ = fVar26;
    auVar23 = vdivps_avx(local_128,auVar67);
    auVar86._0_4_ = auVar25._0_4_ / fVar26;
    auVar86._4_12_ = auVar25._4_12_;
    pAVar1 = (AssertHelperData *)vmovlps_avx(auVar23);
    local_170.super_Tuple3<pbrt::Vector3,_float>.x = SUB84(pAVar1,0);
    local_170.super_Tuple3<pbrt::Vector3,_float>.y = (float)((ulong)pAVar1 >> 0x20);
    auVar75._8_4_ = 0x80000000;
    auVar75._0_8_ = 0x8000000080000000;
    auVar75._12_4_ = 0x80000000;
    local_108 = ZEXT416((uint)local_170.super_Tuple3<pbrt::Vector3,_float>.y);
    auVar68._8_4_ = 0x7fffffff;
    auVar68._0_8_ = 0x7fffffff7fffffff;
    auVar68._12_4_ = 0x7fffffff;
    local_98 = vpternlogd_avx512vl(ZEXT416((uint)local_160._4_4_),local_108 ^ auVar75,auVar68,0xe4);
    local_128 = ZEXT416((uint)local_170.super_Tuple3<pbrt::Vector3,_float>.x);
    _local_88 = vinsertps_avx(auVar86,local_128,0x10);
    auVar47._0_8_ = local_88 ^ 0x8000000080000000;
    auVar47._8_4_ = local_88._8_4_ ^ 0x80000000;
    auVar47._12_4_ = local_88._12_4_ ^ 0x80000000;
    auVar23 = vinsertps_avx(local_118,ZEXT416((uint)local_160._0_4_),0x10);
    local_58 = vpternlogd_avx512vl(auVar23,auVar47,auVar68,0xe4);
    local_68 = vpshufd_avx(local_58,0xf5);
    local_160._4_4_ = local_98._0_4_;
    local_160._0_4_ = local_68._0_4_;
    local_160._8_4_ = local_58._0_4_;
    local_a8._0_8_ = (undefined8)local_68._0_4_;
    local_78._0_8_ = (undefined8)local_98._0_4_;
    local_b0 = (double)(float)local_160._8_4_;
    dVar27 = local_b0 * local_b0 +
             (double)local_a8._0_8_ * (double)local_a8._0_8_ +
             (double)local_78._0_8_ * (double)local_78._0_8_;
    local_118 = auVar86;
    local_170.super_Tuple3<pbrt::Vector3,_float>._0_8_ = pAVar1;
    local_170.super_Tuple3<pbrt::Vector3,_float>.z = auVar86._0_4_;
    if (dVar27 < 0.0) {
      dVar27 = sqrt(dVar27);
      fVar26 = (float)local_108._0_4_;
    }
    else {
      auVar48._8_8_ = 0;
      auVar48._0_8_ = dVar27;
      auVar23 = vsqrtsd_avx(auVar48,auVar48);
      dVar27 = auVar23._0_8_;
      fVar26 = local_170.super_Tuple3<pbrt::Vector3,_float>.y;
    }
    lVar15 = local_d8;
    dVar83 = (double)(float)local_128._0_4_;
    dVar87 = (double)fVar26;
    dVar88 = (double)(float)local_118._0_4_;
    dVar28 = dVar88 * dVar88 + dVar83 * dVar83 + dVar87 * dVar87;
    if (dVar28 < 0.0) {
      local_d0 = dVar83;
      local_c8 = dVar88;
      local_c0 = dVar27;
      local_40 = dVar87;
      dVar28 = sqrt(dVar28);
      uVar77 = 0;
      dVar83 = local_d0;
      dVar87 = local_40;
      dVar88 = local_c8;
      dVar27 = local_c0;
    }
    else {
      auVar49._8_8_ = 0;
      auVar49._0_8_ = dVar28;
      auVar23 = vsqrtsd_avx(auVar49,auVar49);
      dVar28 = auVar23._0_8_;
      uVar77 = in_XMM8_Qb;
    }
    auVar69._0_8_ = (double)local_a8._0_8_ / dVar27;
    auVar69._8_8_ = 0;
    auVar79._0_8_ = local_b0 / dVar27;
    auVar79._8_8_ = 0;
    auVar82._0_8_ = dVar83 / dVar28;
    auVar82._8_8_ = uVar77;
    auVar76._8_8_ = 0;
    auVar76._0_8_ = ((double)local_78._0_8_ / dVar27) * (dVar87 / dVar28);
    auVar23 = vfmadd231sd_fma(auVar76,auVar69,auVar82);
    auVar50._0_8_ = dVar88 / dVar28;
    auVar50._8_8_ = uVar77;
    auVar23 = vfmadd213sd_fma(auVar50,auVar79,auVar23);
    dVar27 = acos(auVar23._0_8_);
    local_a8._0_8_ = dVar27;
    auVar23 = vfmadd132ss_fma(local_128,
                              ZEXT416((uint)((float)local_108._0_4_ * (float)local_98._0_4_)),
                              ZEXT416((uint)local_68._0_4_));
    auVar23 = vfmadd213ss_fma(local_118,local_58,auVar23);
    if (0.0 <= auVar23._0_4_) {
      auVar23 = vsubps_avx(_local_88,local_58);
      auVar70._0_4_ = auVar23._0_4_ * auVar23._0_4_;
      auVar70._4_4_ = auVar23._4_4_ * auVar23._4_4_;
      auVar70._8_4_ = auVar23._8_4_ * auVar23._8_4_;
      auVar70._12_4_ = auVar23._12_4_ * auVar23._12_4_;
      auVar23 = vmovshdup_avx(auVar70);
      fVar26 = auVar70._0_4_ +
               auVar23._0_4_ +
               ((float)local_108._0_4_ - (float)local_98._0_4_) *
               ((float)local_108._0_4_ - (float)local_98._0_4_);
      if (fVar26 < 0.0) {
        fVar26 = sqrtf(fVar26);
      }
      else {
        auVar23 = vsqrtss_avx(ZEXT416((uint)fVar26),ZEXT416((uint)fVar26));
        fVar26 = auVar23._0_4_;
      }
      auVar23 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),ZEXT416((uint)(fVar26 * 0.5)));
      uVar77 = vcmpss_avx512f(ZEXT416((uint)(fVar26 * 0.5)),SUB6416(ZEXT464(0xbf800000),0),1);
      bVar12 = (bool)((byte)uVar77 & 1);
      fVar26 = asinf((float)((uint)bVar12 * -0x40800000 + (uint)!bVar12 * auVar23._0_4_));
      fVar26 = fVar26 + fVar26;
    }
    else {
      fVar26 = local_58._0_4_ + (float)local_88._0_4_;
      fVar54 = local_58._4_4_ + (float)local_88._4_4_;
      fVar55 = local_58._8_4_ + fStack_80;
      fVar56 = local_58._12_4_ + fStack_7c;
      auVar51._0_4_ = fVar26 * fVar26;
      auVar51._4_4_ = fVar54 * fVar54;
      auVar51._8_4_ = fVar55 * fVar55;
      auVar51._12_4_ = fVar56 * fVar56;
      auVar23 = vmovshdup_avx(auVar51);
      fVar26 = auVar51._0_4_ +
               auVar23._0_4_ +
               ((float)local_108._0_4_ + (float)local_98._0_4_) *
               ((float)local_108._0_4_ + (float)local_98._0_4_);
      if (fVar26 < 0.0) {
        fVar26 = sqrtf(fVar26);
      }
      else {
        auVar23 = vsqrtss_avx(ZEXT416((uint)fVar26),ZEXT416((uint)fVar26));
        fVar26 = auVar23._0_4_;
      }
      auVar23 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),ZEXT416((uint)(fVar26 * 0.5)));
      uVar77 = vcmpss_avx512f(ZEXT416((uint)(fVar26 * 0.5)),SUB6416(ZEXT464(0xbf800000),0),1);
      bVar12 = (bool)((byte)uVar77 & 1);
      auVar53._0_4_ = asinf((float)((uint)bVar12 * -0x40800000 + (uint)!bVar12 * auVar23._0_4_));
      auVar53._4_60_ = extraout_var_00;
      auVar23 = vfmadd132ss_fma(auVar53._0_16_,SUB6416(ZEXT464(0x40490fdb),0),ZEXT416(0xc0000000));
      fVar26 = auVar23._0_4_;
    }
    local_14c = (float)(double)local_a8._0_8_;
    local_128._0_4_ = fVar26;
    auVar10._8_4_ = 0x7fffffff;
    auVar10._0_8_ = 0x7fffffff7fffffff;
    auVar10._12_4_ = 0x7fffffff;
    auVar23 = vandps_avx512vl(ZEXT416((uint)(local_14c - fVar26)),auVar10);
    local_118._0_4_ = local_14c;
    local_14c = auVar23._0_4_ / local_14c;
    local_178.data_ = (AssertHelperData *)&DAT_3ed4f8b588e368f1;
    testing::internal::CmpHelperLT<float,double>
              ((internal *)&local_148,"err","5e-6",&local_14c,(double *)&local_178);
    if ((char)local_148._M_dataplus._M_p == '\0') {
      testing::Message::Message((Message *)&local_178);
      std::ostream::_M_insert<double>((double)(float)local_118._0_4_);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&(local_178.data_)->line,"vs ",3);
      std::ostream::_M_insert<double>((double)(float)local_128._0_4_);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&(local_178.data_)->line,", a: ",5);
      pbrt::operator<<((ostream *)&(local_178.data_)->line,(Vector3<float> *)local_160);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&(local_178.data_)->line,", b: ",5);
      pbrt::operator<<((ostream *)&(local_178.data_)->line,&local_170);
      pcVar17 = "";
      if ((undefined8 *)local_148._M_string_length != (undefined8 *)0x0) {
        pcVar17 = *(char **)local_148._M_string_length;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_e0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/vecmath_test.cpp"
                 ,0x82,pcVar17);
      testing::internal::AssertHelper::operator=(&local_e0,(Message *)&local_178);
      testing::internal::AssertHelper::~AssertHelper(&local_e0);
      if (local_178.data_ != (AssertHelperData *)0x0) {
        bVar12 = testing::internal::IsTrue(true);
        if ((bVar12) && (local_178.data_ != (AssertHelperData *)0x0)) {
          (**(code **)(*(long *)local_178.data_ + 8))();
        }
        local_178.data_ = (AssertHelperData *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_148._M_string_length,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    lVar19 = lVar19 + -0x7e9ce66163b5a5d2;
    lVar21 = lVar21 + -0x689413737f6b53e8;
    local_e8 = local_e8 + -0x71f99dac5a85d7c6;
    local_f0 = local_f0 + 0x60e0b608522fd834;
    lVar20 = lVar20 + 0x41fabb6874eecd26;
    lVar15 = lVar15 + 2;
    lVar16 = (long)local_b8 + -0x4f5c17a566d501a4;
    uVar22 = uVar22 + 0x7fb5d329728ea185;
  } while (lVar15 != 0x1343a41);
  sqrtl();
  local_118._0_10_ = (longdouble)1 / in_ST0;
  sqrtl();
  local_e0.data_._0_4_ = 0x40490fdb;
  acosl();
  local_14c = (float)in_ST2;
  local_34 = 3.1415455;
  testing::internal::CmpHelperEQ<float,float>
            ((internal *)local_160,"abet","precise",&local_34,&local_14c);
  if (local_160[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_170);
    local_148._M_string_length = 0;
    local_148.field_2._M_local_buf[0] = '\0';
    local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
    pbrt::detail::stringPrintfRecursive<float&>(&local_148,"vs naive %f",(float *)&local_e0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_170.super_Tuple3<pbrt::Vector3,_float>._0_8_ + 0x10),
               local_148._M_dataplus._M_p,local_148._M_string_length);
    if ((undefined8 *)CONCAT44(uStack_154,local_160._8_4_) == (undefined8 *)0x0) {
      pcVar17 = "";
    }
    else {
      pcVar17 = *(char **)CONCAT44(uStack_154,local_160._8_4_);
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_178,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/vecmath_test.cpp"
               ,0x91,pcVar17);
    testing::internal::AssertHelper::operator=(&local_178,(Message *)&local_170);
    testing::internal::AssertHelper::~AssertHelper(&local_178);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_148._M_dataplus._M_p != &local_148.field_2) {
      operator_delete(local_148._M_dataplus._M_p,
                      CONCAT71(local_148.field_2._M_allocated_capacity._1_7_,
                               local_148.field_2._M_local_buf[0]) + 1);
    }
    if ((AssertHelperData *)local_170.super_Tuple3<pbrt::Vector3,_float>._0_8_ !=
        (AssertHelperData *)0x0) {
      bVar12 = testing::internal::IsTrue(true);
      if ((bVar12) &&
         ((AssertHelperData *)local_170.super_Tuple3<pbrt::Vector3,_float>._0_8_ !=
          (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_170.super_Tuple3<pbrt::Vector3,_float>._0_8_ + 8))();
      }
      local_170.super_Tuple3<pbrt::Vector3,_float>._0_8_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_160 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  return;
}

Assistant:

TEST(Vector, AngleBetween) {
    EXPECT_EQ(0, AngleBetween(Vector3f(1, 0, 0), Vector3f(1, 0, 0)));

    EXPECT_LT(std::abs(AngleBetween(Vector3f(0, 0, 1), Vector3f(0, 0, -1))) - Pi, 1e-7);
    EXPECT_LT(std::abs(AngleBetween(Vector3f(1, 0, 0), Vector3f(0, 1, 0))) - Pi / 2,
              1e-7);

    Vector3f x = Normalize(Vector3f(1, -3, 10));
    EXPECT_EQ(0, AngleBetween(x, x));
    EXPECT_LT(std::abs(AngleBetween(x, -x) - Pi), 3e-7);

    Float maxErr = 0, sumErr = 0;
    for (int i = 0; i < 100000; ++i) {
        RNG rng(i);
        Vector3f a = Normalize(Vector3f(-1 + 2 * rng.Uniform<Float>(),
                                        -1 + 2 * rng.Uniform<Float>(),
                                        -1 + 2 * rng.Uniform<Float>()));
        Vector3f b = Normalize(Vector3f(-1 + 2 * rng.Uniform<Float>(),
                                        -1 + 2 * rng.Uniform<Float>(),
                                        -1 + 2 * rng.Uniform<Float>()));

        Vector3<double> ad(a), bd(b);
        ad = Normalize(ad);
        bd = Normalize(bd);

        Float v[2] = {Float(std::acos(Dot(ad, bd))), AngleBetween(a, b)};
        Float err = std::abs(v[0] - v[1]) / v[0];
        maxErr = std::max(err, maxErr);
        sumErr += err;
        EXPECT_LT(err, 5e-6) << v[0] << "vs " << v[1] << ", a: " << a << ", b: " << b;
    }
    // CO    LOG(WARNING) << "MAXERR " << maxErr << ", sum " << sumErr;
    maxErr = 0;
    sumErr = 0;

    for (int i = 0; i < 100000; ++i) {
        RNG rng(i + 10000000);
        Vector3f a = Normalize(Vector3f(-1 + 2 * rng.Uniform<Float>(),
                                        -1 + 2 * rng.Uniform<Float>(),
                                        -1 + 2 * rng.Uniform<Float>()));
        Vector3f b = Normalize(Vector3f(-1 + 2 * rng.Uniform<Float>(),
                                        -1 + 2 * rng.Uniform<Float>(),
                                        -1 + 2 * rng.Uniform<Float>()));
        // Make them face in opposite-ish directions
        a.x = std::copysign(a.x, -b.x);
        a.y = std::copysign(a.y, -b.y);
        a.z = std::copysign(a.z, -b.z);

        Vector3<double> ad(a), bd(b);
        ad = Normalize(ad);
        bd = Normalize(bd);

        Float v[2] = {Float(std::acos(Dot(ad, bd))), AngleBetween(a, b)};
        Float err = std::abs(v[0] - v[1]) / v[0];
        maxErr = std::max(err, maxErr);
        sumErr += err;
        EXPECT_LT(err, 5e-6) << v[0] << "vs " << v[1] << ", a: " << a << ", b: " << b;
    }
    // CO    LOG(WARNING) << "MAXERR " << maxErr << ", sum " << sumErr;

    Vector3f a(1, 1, 1), b(-1, -1.0001, -1);
    a = Normalize(a);
    b = Normalize(b);
    Vector3<long double> ad(1, 1, 1), bd(-1, -1.0001, -1);
    ad = Normalize(ad);
    bd = Normalize(bd);

    Float naive = SafeACos(Dot(a, b));
    Float precise = std::acos(Clamp(Dot(ad, bd), -1, 1));
    Float abet = AngleBetween(a, b);
    Float old = Pi - 2 * SafeASin(Length(a + b) / 2);
    EXPECT_EQ(abet, precise) << StringPrintf("vs naive %f", naive);
    // CO    LOG(WARNING) << StringPrintf("naive %f (err %f), abet %f (err %f)
    // old %f (err %f)", CO                                 naive,
    // std::abs(naive
    // - precise) / precise, CO                                 abet,
    // std::abs(abet - precise) / precise, CO old, std::abs(old - precise) /
    // precise);
}